

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::_::
Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:422:3)>
::~Deferred(Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:422:3)>
            *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:422:3)>_2
  aVar1;
  long lVar2;
  PromiseArenaMember *node;
  PromiseArenaMember *in_RAX;
  PromiseArenaMember *local_18;
  
  if ((this->maybeFunc).ptr.isSet == true) {
    aVar1 = (this->maybeFunc).ptr.field_1;
    (this->maybeFunc).ptr.isSet = false;
    lVar2 = *(long *)((long)aVar1 + 8);
    local_18 = in_RAX;
    while (lVar2 != 0) {
      TaskSet::Task::pop((Task *)&stack0xffffffffffffffe8);
      node = local_18;
      if (local_18 != (PromiseArenaMember *)0x0) {
        local_18 = (PromiseArenaMember *)0x0;
        PromiseDisposer::dispose(node);
      }
      lVar2 = *(long *)((long)aVar1 + 8);
    }
  }
  return;
}

Assistant:

inline NullableValue(NullableValue&& other)
      : isSet(other.isSet) {
    if (isSet) {
      ctor(value, kj::mv(other.value));
    }
  }